

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

nullres nullcLoadModuleBySource(char *module,char *code)

{
  nullres nVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  char cVar6;
  char *pcVar7;
  char *bytecode;
  TraceScope traceScope;
  char moduleRoot [1024];
  char path [1024];
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    return '\0';
  }
  if ((nullcLoadModuleBySource::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&nullcLoadModuleBySource::token), iVar2 != 0)) {
    nullcLoadModuleBySource::token = NULLC::TraceGetToken("nullc","nullcLoadModuleBySource");
    __cxa_guard_release(&nullcLoadModuleBySource::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,nullcLoadModuleBySource::token);
  NULLC::TraceLabel(module);
  moduleRoot[0] = '\0';
  pcVar3 = strrchr(module,0x2e);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    NULLC::SafeSprintf(moduleRoot,0x400,"%.*s",(ulong)(uint)((int)pcVar3 - (int)module),module);
    sVar4 = strlen(moduleRoot);
    for (uVar5 = 0; (sVar4 & 0xffffffff) != uVar5; uVar5 = uVar5 + 1) {
      cVar6 = moduleRoot[uVar5];
      if (cVar6 == '.') {
        cVar6 = '/';
      }
      moduleRoot[uVar5] = cVar6;
    }
    pcVar3 = moduleRoot;
    if (moduleRoot[0] == '\0') {
      pcVar3 = (char *)0x0;
    }
  }
  nVar1 = nullcCompileWithModuleRoot(code,pcVar3);
  if (nVar1 != '\0') {
    sVar4 = strlen(module);
    if (sVar4 < 0x201) {
      strcpy(path,module);
      pcVar3 = path;
      while (pcVar7 = pcVar3, *pcVar7 != '\0') {
        pcVar3 = pcVar7 + 1;
        if (*pcVar7 == '.') {
          *pcVar7 = '/';
        }
      }
      sVar4 = strlen(path);
      builtin_strncpy(path + sVar4,".nc",4);
      pcVar3 = BinaryCache::GetBytecode(path);
      if (pcVar3 == (char *)0x0) {
        bytecode = (char *)0x0;
        nullcGetBytecode(&bytecode);
        nullcClean();
        BinaryCache::PutBytecode(path,bytecode,(Lexeme *)0x0,0);
        nVar1 = '\x01';
        goto LAB_0010ac24;
      }
      NULLC::nullcLastError = "ERROR: module already loaded";
    }
    else {
      NULLC::nullcLastError = "ERROR: module name is too long";
    }
  }
  nVar1 = '\0';
LAB_0010ac24:
  NULLC::TraceScope::~TraceScope(&traceScope);
  return nVar1;
}

Assistant:

nullres nullcLoadModuleBySource(const char* module, const char* code)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcLoadModuleBySource");
	TRACE_LABEL(module);

	const unsigned moduleRootLength = 1024;
	char moduleRoot[moduleRootLength];
	*moduleRoot = 0;

	if(const char *pos = strrchr(module, '.'))
	{
		NULLC::SafeSprintf(moduleRoot, moduleRootLength, "%.*s", unsigned(pos - module), module);

		for(unsigned i = 0, e = unsigned(strlen(moduleRoot)); i < e; i++)
			moduleRoot[i] = moduleRoot[i] == '.' ? '/' : moduleRoot[i];
	}

	if(!nullcCompileWithModuleRoot(code, *moduleRoot ? moduleRoot : NULL))
		return false;

	if(strlen(module) > 512)
	{
		nullcLastError = "ERROR: module name is too long";
		return false;
	}

	char	path[1024];
	strcpy(path, module);
	char	*pos = path;
	while(*pos)
		if(*pos++ == '.')
			pos[-1] = '/';
	strcat(path, ".nc");

	if(BinaryCache::GetBytecode(path))
	{
		nullcLastError = "ERROR: module already loaded";
		return false;
	}

	char *bytecode = NULL;
	nullcGetBytecode(&bytecode);
	nullcClean();

	BinaryCache::PutBytecode(path, bytecode, NULL, 0);
	return 1;
}